

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptFunction::DeleteProperty
          (JavascriptFunction *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  bool bVar1;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  char16 *varName;
  ScriptContext *pSVar2;
  ThreadContext *this_02;
  DynamicTypeHandler *this_03;
  BOOL result;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  JavascriptFunction *this_local;
  
  if (((propertyId | 2U) == 0x1cf) && (bVar1 = HasRestrictedProperties(this), bVar1)) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
    varName = PropertyRecord::GetBuffer(this_01);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,pSVar2,varName);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyId,flags);
    if ((this_local._4_4_ != 0) && ((propertyId == 0x124 || (propertyId == 0x12)))) {
      InvalidateConstructorCacheOnPrototypeChange(this);
      pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      this_02 = ScriptContext::GetThreadContext(pSVar2);
      ThreadContext::InvalidateIsInstInlineCachesForFunction(this_02,this);
      if (propertyId == 0x124) {
        this_03 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
        DynamicTypeHandler::ClearHasKnownSlot0(this_03);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptFunction::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        switch (propertyId)
        {
        case PropertyIds::caller:
        case PropertyIds::arguments:
            if (this->HasRestrictedProperties())
            {
                JavascriptError::ThrowCantDeleteIfStrictMode(flags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());
                return false;
            }
            break;
        }

        BOOL result = DynamicObject::DeleteProperty(propertyId, flags);

        if (result && (propertyId == PropertyIds::prototype || propertyId == PropertyIds::_symbolHasInstance))
        {
            InvalidateConstructorCacheOnPrototypeChange();
            this->GetScriptContext()->GetThreadContext()->InvalidateIsInstInlineCachesForFunction(this);
            if (propertyId == PropertyIds::prototype)
            {
                this->GetTypeHandler()->ClearHasKnownSlot0();
            }
        }

        return result;
    }